

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

void InverseMoveToFrontTransform(uint8_t *v,uint32_t v_len,BrotliDecoderStateInternal *state)

{
  uint8_t *__src;
  byte bVar1;
  uint8_t uVar2;
  ulong uVar3;
  uint uVar4;
  uint32_t uVar5;
  long lVar6;
  
  uVar4 = state->mtf_upper_bound + 1;
  uVar3 = 2;
  if (2 < uVar4) {
    uVar3 = (ulong)uVar4;
  }
  state->mtf[1] = 0x3020100;
  uVar5 = 0x7060504;
  lVar6 = 0;
  do {
    state->mtf[lVar6 + 2] = uVar5;
    lVar6 = lVar6 + 1;
    uVar5 = uVar5 + 0x4040404;
  } while (uVar3 - 1 != lVar6);
  if (v_len == 0) {
    uVar5 = 0;
  }
  else {
    __src = (uint8_t *)((long)state->mtf + 3);
    uVar3 = 0;
    uVar4 = 0;
    do {
      bVar1 = v[uVar3];
      uVar2 = *(uint8_t *)((long)(state->mtf + 1) + (ulong)bVar1);
      v[uVar3] = uVar2;
      *__src = uVar2;
      memmove(state->mtf + 1,__src,(ulong)bVar1 + 1);
      uVar4 = uVar4 | bVar1;
      uVar3 = uVar3 + 1;
    } while (v_len != uVar3);
    uVar5 = uVar4 >> 2;
  }
  state->mtf_upper_bound = uVar5;
  return;
}

Assistant:

static BROTLI_NOINLINE void InverseMoveToFrontTransform(
    uint8_t* v, uint32_t v_len, BrotliDecoderState* state) {
  /* Reinitialize elements that could have been changed. */
  uint32_t i = 1;
  uint32_t upper_bound = state->mtf_upper_bound;
  uint32_t* mtf = &state->mtf[1];  /* Make mtf[-1] addressable. */
  uint8_t* mtf_u8 = (uint8_t*)mtf;
  /* Load endian-aware constant. */
  const uint8_t b0123[4] = {0, 1, 2, 3};
  uint32_t pattern;
  memcpy(&pattern, &b0123, 4);

  /* Initialize list using 4 consequent values pattern. */
  mtf[0] = pattern;
  do {
    pattern += 0x04040404;  /* Advance all 4 values by 4. */
    mtf[i] = pattern;
    i++;
  } while (i <= upper_bound);

  /* Transform the input. */
  upper_bound = 0;
  for (i = 0; i < v_len; ++i) {
    int index = v[i];
    uint8_t value = mtf_u8[index];
    upper_bound |= v[i];
    v[i] = value;
    mtf_u8[-1] = value;
    do {
      index--;
      mtf_u8[index + 1] = mtf_u8[index];
    } while (index >= 0);
  }
  /* Remember amount of elements to be reinitialized. */
  state->mtf_upper_bound = upper_bound >> 2;
}